

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbMfs.c
# Opt level: O0

Acb_Mfs_t * Acb_MfsStart(Acb_Ntk_t *pNtk,Acb_Par_t *pPars)

{
  Acb_Mfs_t *pAVar1;
  abctime aVar2;
  sat_solver *psVar3;
  Vec_Int_t *pVVar4;
  Acb_Mfs_t *p;
  Acb_Par_t *pPars_local;
  Acb_Ntk_t *pNtk_local;
  
  pAVar1 = (Acb_Mfs_t *)calloc(1,0xb0);
  pAVar1->pNtk = pNtk;
  pAVar1->pPars = pPars;
  aVar2 = Abc_Clock();
  pAVar1->timeTotal = aVar2;
  psVar3 = sat_solver_new();
  pAVar1->pSat[0] = psVar3;
  psVar3 = sat_solver_new();
  pAVar1->pSat[1] = psVar3;
  psVar3 = sat_solver_new();
  pAVar1->pSat[2] = psVar3;
  pVVar4 = Vec_IntAlloc(100);
  pAVar1->vSupp = pVVar4;
  pVVar4 = Vec_IntAlloc(100);
  pAVar1->vFlip = pVVar4;
  pVVar4 = Vec_IntAlloc(100);
  pAVar1->vValues = pVVar4;
  return pAVar1;
}

Assistant:

Acb_Mfs_t * Acb_MfsStart( Acb_Ntk_t * pNtk, Acb_Par_t * pPars )
{
    Acb_Mfs_t * p = ABC_CALLOC( Acb_Mfs_t, 1 );
    p->pNtk       = pNtk;
    p->pPars      = pPars;
    p->timeTotal  = Abc_Clock();
    p->pSat[0]    = sat_solver_new();
    p->pSat[1]    = sat_solver_new();
    p->pSat[2]    = sat_solver_new();
    p->vSupp      = Vec_IntAlloc(100);
    p->vFlip      = Vec_IntAlloc(100);
    p->vValues    = Vec_IntAlloc(100);
    return p;
}